

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Schema.cc
# Opt level: O1

void __thiscall avro::UnionSchema::UnionSchema(UnionSchema *this)

{
  Node *p;
  
  p = (Node *)operator_new(0x30);
  p->type_ = AVRO_UNION;
  p->locked_ = false;
  p[1]._vptr_Node = (_func_int **)0x0;
  p[1].type_ = AVRO_STRING;
  p[1].locked_ = false;
  *(undefined3 *)&p[1].field_0xd = 0;
  p[2]._vptr_Node = (_func_int **)0x0;
  p->_vptr_Node = (_func_int **)&PTR__NodeImpl_00193138;
  (this->super_Schema)._vptr_Schema = (_func_int **)&PTR__Schema_00194380;
  boost::shared_ptr<avro::Node>::shared_ptr<avro::Node>(&(this->super_Schema).node_,p);
  (this->super_Schema)._vptr_Schema = (_func_int **)&PTR__Schema_00194430;
  return;
}

Assistant:

UnionSchema::UnionSchema() :
    Schema(new NodeUnion)
{ }